

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstrformat.cpp
# Opt level: O2

int StringFormat::writepad(OutputFunc output,void *outputData,char *pad,int padsize,int spaceToFill)

{
  int iVar1;
  int iVar2;
  int outlen;
  int iVar3;
  
  iVar3 = 0;
  for (; 0 < spaceToFill; spaceToFill = spaceToFill - iVar1) {
    iVar1 = padsize;
    if (spaceToFill < padsize) {
      iVar1 = spaceToFill;
    }
    iVar2 = (*output)(outputData,pad,iVar1);
    iVar3 = iVar3 + iVar2;
  }
  return iVar3;
}

Assistant:

static int writepad (OutputFunc output, void *outputData, const char *pad, int padsize, int spaceToFill)
	{
		int outlen = 0;
		while (spaceToFill > 0)
		{
			int count = spaceToFill > padsize ? padsize : spaceToFill;
			outlen += output (outputData, pad, count);
			spaceToFill -= count;
		}
		return outlen;
	}